

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Operation::Operation
          (Operation *this,Arena *arena,bool is_message_owned)

{
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Operation_003f9e80;
  (this->inputs_).map_.elements_.num_elements_ = 0;
  (this->inputs_).map_.elements_.num_buckets_ = 1;
  (this->inputs_).map_.elements_.seed_ = 0;
  (this->inputs_).map_.elements_.index_of_first_non_null_ = 1;
  (this->inputs_).map_.elements_.table_ = (void **)&google::protobuf::internal::kGlobalEmptyTable;
  (this->inputs_).map_.elements_.alloc_.arena_ = arena;
  (this->outputs_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->outputs_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->outputs_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->outputs_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->blocks_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->blocks_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->blocks_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->blocks_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->attributes_).map_.elements_.num_elements_ = 0;
  (this->attributes_).map_.elements_.num_buckets_ = 1;
  (this->attributes_).map_.elements_.seed_ = 0;
  (this->attributes_).map_.elements_.index_of_first_non_null_ = 1;
  (this->attributes_).map_.elements_.table_ =
       (void **)&google::protobuf::internal::kGlobalEmptyTable;
  (this->attributes_).map_.elements_.alloc_.arena_ = arena;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  (this->type_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  return;
}

Assistant:

Operation::Operation(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  inputs_(arena),
  outputs_(arena),
  blocks_(arena),
  attributes_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.MILSpec.Operation)
}